

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O2

QSize __thiscall QDockWidgetTitleButton::sizeHint(QDockWidgetTitleButton *this)

{
  char cVar1;
  int iVar2;
  QStyle *pQVar3;
  undefined8 uVar4;
  uint uVar5;
  long in_FS_OFFSET;
  QSize local_40;
  QSize local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QWidget::ensurePolished((QWidget *)this);
  pQVar3 = QWidget::style((QWidget *)this);
  iVar2 = (**(code **)(*(long *)pQVar3 + 0xe0))(pQVar3,0x49,0,this);
  uVar5 = iVar2 * 2;
  QAbstractButton::icon((QAbstractButton *)&local_38);
  cVar1 = QIcon::isNull();
  QIcon::~QIcon((QIcon *)&local_38);
  if (cVar1 == '\0') {
    QAbstractButton::icon((QAbstractButton *)&local_38);
    local_40 = dockButtonIconSize(this);
    uVar4 = QIcon::actualSize(&local_38,(Mode)&local_40,On);
    QIcon::~QIcon((QIcon *)&local_38);
    iVar2 = (int)((ulong)uVar4 >> 0x20);
    if (iVar2 < (int)uVar4) {
      iVar2 = (int)uVar4;
    }
    uVar5 = iVar2 + uVar5;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QSize)((ulong)uVar5 * 0x100000001);
  }
  __stack_chk_fail();
}

Assistant:

QSize QDockWidgetTitleButton::sizeHint() const
{
    ensurePolished();

    int size = 2*style()->pixelMetric(QStyle::PM_DockWidgetTitleBarButtonMargin, nullptr, this);
    if (!icon().isNull()) {
        const QSize sz = icon().actualSize(dockButtonIconSize());
        size += qMax(sz.width(), sz.height());
    }

    return QSize(size, size);
}